

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  byte bVar1;
  u8 uVar2;
  Parse *pParse;
  SrcList *pSVar3;
  sqlite3 *db;
  Vdbe *p;
  WhereLoop *pWVar4;
  Table *pTVar5;
  bool bVar6;
  int iVar7;
  Op *pOVar8;
  Index *pIVar9;
  anon_union_16_2_dad992c1_for_u *paVar10;
  int iVar11;
  WhereLevel *pWVar12;
  int iVar13;
  int op;
  uint uVar14;
  ushort uVar15;
  Index *pIVar16;
  u8 *puVar17;
  ulong uVar18;
  uint uVar19;
  
  pParse = pWInfo->pParse;
  pSVar3 = pWInfo->pTabList;
  db = pParse->db;
  p = pParse->pVdbe;
  uVar18 = (ulong)pWInfo->nLevel;
  if (uVar18 != 0) {
    do {
      pWVar12 = pWInfo->a + (uVar18 - 1);
      pWVar4 = pWInfo->a[uVar18 - 1].pWLoop;
      if (pWInfo->a[uVar18 - 1].op == 0xaa) {
        sqlite3VdbeResolveLabel(p,pWVar12->addrCont);
      }
      else {
        iVar7 = 0;
        iVar13 = 0;
        if ((((pWInfo->eDistinct == '\x02') && (uVar18 == pWInfo->nLevel)) &&
            ((pWVar4->wsFlags & 0x200) != 0)) &&
           (pIVar9 = (pWVar4->u).btree.pIndex, iVar7 = iVar13, (pIVar9->field_0x63 & 0x80) != 0)) {
          uVar15 = (pWVar4->u).btree.nIdxCol;
          if ((uVar15 != 0) && (uVar19 = (uint)uVar15, 0x23 < pIVar9->aiRowLogEst[uVar15])) {
            iVar7 = pParse->nMem + 1;
            uVar14 = 0;
            do {
              sqlite3VdbeAddOp3(p,0x5a,pWVar12->iIdxCur,uVar14,iVar7 + uVar14);
              uVar14 = uVar14 + 1;
            } while (uVar19 != uVar14);
            pParse->nMem = pParse->nMem + uVar19 + 1;
            iVar7 = sqlite3VdbeAddOp3(p,(uint)(pWVar12->op != '\x04') * 3 + 0x16,pWVar12->iIdxCur,0,
                                      iVar7);
            if (p->db->mallocFailed == '\0') {
              pOVar8 = p->aOp;
              pOVar8[iVar7].p4type = -3;
              pOVar8[iVar7].p4.i = uVar19;
            }
            sqlite3VdbeAddOp3(p,0xb,1,pWVar12->p2,0);
          }
        }
        sqlite3VdbeResolveLabel(p,pWVar12->addrCont);
        sqlite3VdbeAddOp3(p,(uint)pWVar12->op,pWVar12->p1,pWVar12->p2,(uint)pWVar12->p3);
        iVar13 = p->nOp;
        if (0 < (long)iVar13) {
          p->aOp[(long)iVar13 + -1].p5 = (ushort)pWVar12->p5;
        }
        if (iVar7 != 0) {
          pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p->db->mallocFailed == '\0') {
            iVar11 = iVar13 + -1;
            if (-1 < iVar7) {
              iVar11 = iVar7;
            }
            pOVar8 = p->aOp + iVar11;
          }
          pOVar8->p2 = iVar13;
        }
      }
      if (((pWVar4->wsFlags & 0x800) != 0) && (0 < (pWVar12->u).in.nIn)) {
        sqlite3VdbeResolveLabel(p,pWVar12->addrNxt);
        iVar7 = (pWVar12->u).in.nIn;
        if (0 < (long)iVar7) {
          iVar13 = iVar7 + 1;
          puVar17 = &(pWVar12->u).in.aInLoop[(long)iVar7 + -1].eEndLoopOp;
          do {
            iVar7 = p->nOp;
            pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (p->db->mallocFailed == '\0') {
              iVar11 = iVar7 + -1;
              if (-2 < *(int *)(puVar17 + -0xc)) {
                iVar11 = *(int *)(puVar17 + -0xc) + 1;
              }
              pOVar8 = p->aOp + iVar11;
            }
            pOVar8->p2 = iVar7;
            if (*puVar17 != 0xaa) {
              iVar11 = *(int *)(puVar17 + -4);
              if ((iVar11 != 0) &&
                 (iVar7 = sqlite3VdbeAddOp3(p,0x1a,pWVar12->iIdxCur,iVar7 + 2,*(int *)(puVar17 + -8)
                                           ), p->db->mallocFailed == '\0')) {
                pOVar8 = p->aOp;
                pOVar8[iVar7].p4type = -3;
                pOVar8[iVar7].p4.i = iVar11;
              }
              sqlite3VdbeAddOp3(p,(uint)*puVar17,((InLoop *)(puVar17 + -0x10))->iCur,
                                *(int *)(puVar17 + -0xc),0);
            }
            pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (p->db->mallocFailed == '\0') {
              iVar7 = *(int *)(puVar17 + -0xc);
              if (*(int *)(puVar17 + -0xc) < 1) {
                iVar7 = p->nOp;
              }
              pOVar8 = p->aOp + (long)iVar7 + -1;
            }
            pOVar8->p2 = p->nOp;
            iVar13 = iVar13 + -1;
            puVar17 = puVar17 + -0x14;
          } while (1 < iVar13);
        }
      }
      sqlite3VdbeResolveLabel(p,pWVar12->addrBrk);
      if (pWVar12->addrSkip != 0) {
        sqlite3VdbeAddOp3(p,0xb,0,pWVar12->addrSkip,0);
        iVar7 = p->nOp;
        if (p->db->mallocFailed == '\0') {
          iVar13 = pWVar12->addrSkip;
          iVar11 = iVar13;
          if (iVar13 < 0) {
            iVar11 = iVar7 + -1;
          }
          p->aOp[iVar11].p2 = iVar7;
          iVar11 = iVar13 + -2;
          if (iVar13 < 2) {
            iVar11 = iVar7 + -1;
          }
          pOVar8 = p->aOp + iVar11;
        }
        else {
          pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
          DAT_00239d60 = iVar7;
        }
        pOVar8->p2 = iVar7;
      }
      if (pWVar12->addrLikeRep != 0) {
        sqlite3VdbeAddOp3(p,0x31,pWVar12->iLikeRepCntr >> 1,pWVar12->addrLikeRep,0);
      }
      if (pWVar12->iLeftJoin != 0) {
        uVar19 = pWVar4->wsFlags;
        iVar7 = sqlite3VdbeAddOp3(p,0x2f,pWVar12->iLeftJoin,0,0);
        if ((uVar19 & 0x40) == 0) {
          sqlite3VdbeAddOp3(p,0x81,pWVar12->iTabCur,0,0);
        }
        if (((uVar19 >> 9 & 1) != 0) ||
           (((uVar19 >> 0xd & 1) != 0 && ((pWVar12->u).pCovidx != (Index *)0x0)))) {
          sqlite3VdbeAddOp3(p,0x81,pWVar12->iIdxCur,0,0);
        }
        if (pWVar12->op == 'B') {
          iVar13 = pWVar12->addrFirst;
          iVar11 = pWVar12->p1;
          op = 0xc;
        }
        else {
          iVar13 = pWVar12->addrFirst;
          op = 0xb;
          iVar11 = 0;
        }
        sqlite3VdbeAddOp3(p,op,iVar11,iVar13,0);
        pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          iVar13 = p->nOp + -1;
          if (-1 < iVar7) {
            iVar13 = iVar7;
          }
          pOVar8 = p->aOp + iVar13;
        }
        pOVar8->p2 = p->nOp;
      }
      bVar6 = 1 < (long)uVar18;
      uVar18 = uVar18 - 1;
    } while (bVar6);
  }
  sqlite3VdbeResolveLabel(p,pWInfo->iBreak);
  if (pWInfo->nLevel != '\0') {
    pWVar12 = pWInfo->a;
    uVar19 = 0;
    do {
      bVar1 = pWVar12->iFrom;
      if ((pSVar3->a[bVar1].fg.field_0x1 & 0x10) == 0) {
        uVar14 = pWVar12->pWLoop->wsFlags;
        if ((uVar14 & 0x240) == 0) {
          if ((uVar14 >> 0xd & 1) != 0) {
            paVar10 = &pWVar12->u;
            goto LAB_00191b51;
          }
          pIVar9 = (Index *)0x0;
        }
        else {
          paVar10 = (anon_union_16_2_dad992c1_for_u *)&(pWVar12->pWLoop->u).btree.pIndex;
LAB_00191b51:
          pIVar9 = paVar10->pCovidx;
        }
        if ((pIVar9 != (Index *)0x0) &&
           (((pTVar5 = pSVar3->a[bVar1].pTab, pWInfo->eOnePass == '\0' ||
             ((pIVar9->pTable->tabFlags & 0x20) != 0)) && (db->mallocFailed == '\0')))) {
          iVar7 = p->nOp;
          iVar13 = pWVar12->addrBody;
          pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p->db->mallocFailed == '\0') {
            iVar11 = iVar7 + -1;
            if (-1 < iVar13) {
              iVar11 = iVar13;
            }
            pOVar8 = p->aOp + iVar11;
          }
          if (iVar13 < iVar7) {
            iVar11 = pWVar12->iTabCur;
            do {
              if (pOVar8->p1 == iVar11) {
                uVar2 = pOVar8->opcode;
                if (uVar2 == '\x15') {
LAB_00191c7c:
                  pOVar8->p1 = pWVar12->iIdxCur;
                }
                else if (uVar2 == 0x80) {
                  pOVar8->p1 = pWVar12->iIdxCur;
                  pOVar8->opcode = 0x87;
                }
                else if (uVar2 == 'Z') {
                  uVar14 = pOVar8->p2;
                  if ((pTVar5->tabFlags & 0x20) != 0) {
                    for (pIVar16 = pTVar5->pIndex;
                        (pIVar16 != (Index *)0x0 && ((*(ushort *)&pIVar16->field_0x63 & 3) != 2));
                        pIVar16 = pIVar16->pNext) {
                    }
                    uVar14 = (uint)(ushort)pIVar16->aiColumn[(int)uVar14];
                  }
                  uVar15 = 0xffff;
                  if ((ulong)pIVar9->nColumn != 0) {
                    uVar18 = 0;
                    do {
                      if (pIVar9->aiColumn[uVar18] == (short)uVar14) {
                        uVar15 = (ushort)uVar18;
                        break;
                      }
                      uVar18 = uVar18 + 1;
                    } while (pIVar9->nColumn != uVar18);
                  }
                  if (-1 < (short)uVar15) {
                    pOVar8->p2 = (uint)uVar15;
                    goto LAB_00191c7c;
                  }
                }
              }
              iVar13 = iVar13 + 1;
              pOVar8 = pOVar8 + 1;
            } while (iVar13 != iVar7);
          }
        }
      }
      else {
        translateColumnToCopy
                  (pParse,pWVar12->addrBody,pWVar12->iTabCur,pSVar3->a[bVar1].regResult,0);
      }
      uVar19 = uVar19 + 1;
      pWVar12 = pWVar12 + 1;
    } while (uVar19 < pWInfo->nLevel);
  }
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nIdxCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else{
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( pLoop->wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            assert( pLoop->wsFlags & WHERE_IN_EARLYOUT );
            sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                              sqlite3VdbeCurrentAddr(v)+2,
                              pIn->iBase, pIn->nPrefix);
            VdbeCoverage(v);
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        assert( pLevel->iTabCur==pTabList->a[pLevel->iFrom].iCursor );
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED) 
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCovidx) 
      ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp;
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

#ifdef SQLITE_ENABLE_EARLY_CURSOR_CLOSE
    /* Close all of the cursors that were opened by sqlite3WhereBegin.
    ** Except, do not close cursors that will be reused by the OR optimization
    ** (WHERE_OR_SUBCLAUSE).  And do not close the OP_OpenWrite cursors
    ** created for the ONEPASS optimization.
    */
    if( (pTab->tabFlags & TF_Ephemeral)==0
     && pTab->pSelect==0
     && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
    ){
      int ws = pLoop->wsFlags;
      if( pWInfo->eOnePass==ONEPASS_OFF && (ws & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_Close, pTabItem->iCursor);
      }
      if( (ws & WHERE_INDEXED)!=0
       && (ws & (WHERE_IPK|WHERE_AUTO_INDEX))==0 
       && pLevel->iIdxCur!=pWInfo->aiCurOnePass[1]
      ){
        sqlite3VdbeAddOp1(v, OP_Close, pLevel->iIdxCur);
      }
    }
#endif

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx
     && (pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable))
     && !db->mallocFailed
    ){
      last = sqlite3VdbeCurrentAddr(v);
      k = pLevel->addrBody;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE opcodes in range %d..%d\n", k, last-1);
      }
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      for(; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }
          x = sqlite3ColumnOfIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }
          assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 || x>=0 
              || pWInfo->eOnePass );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
      }
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}